

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArmParser.cpp
# Opt level: O3

bool __thiscall ArmParser::parseImmediate(ArmParser *this,Parser *parser,Expression *dest)

{
  ArmRegisterValue *dest_00;
  _List_node_base *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  bool bVar4;
  ArmOpcodeVariables tempVars;
  Expression local_298;
  ArmOpcodeVariables local_278;
  
  p_Var1 = (((parser->entries).
             super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].tokenizer)->position).it._M_node;
  local_278.Shift.reg.name._name._M_dataplus._M_p = (pointer)&local_278.Shift.reg.name._name.field_2
  ;
  local_278.Shift.reg.name._name.field_2._M_allocated_capacity = 0;
  local_278.Shift.reg.name._name.field_2._8_8_ = 0;
  local_278.Shift.reg.name._name._M_string_length = 0;
  local_278.Shift.ShiftExpression.expression.
  super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_278.Shift.ShiftExpression.expression.
  super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_278.Shift.ShiftExpression.constExpression = true;
  local_278.CopData.cd.name._name._M_dataplus._M_p =
       (pointer)&local_278.CopData.cd.name._name.field_2;
  local_278.CopData.cd.name._name.field_2._M_allocated_capacity = 0;
  local_278.CopData.cd.name._name.field_2._8_8_ = 0;
  local_278.CopData.cd.name._name._M_string_length = 0;
  local_278.CopData.cn.name._name._M_dataplus._M_p =
       (pointer)&local_278.CopData.cn.name._name.field_2;
  local_278.CopData.cn.name._name.field_2._M_allocated_capacity = 0;
  local_278.CopData.cn.name._name.field_2._8_8_ = 0;
  local_278.CopData.cn.name._name._M_string_length = 0;
  local_278.CopData.cm.name._name._M_dataplus._M_p =
       (pointer)&local_278.CopData.cm.name._name.field_2;
  local_278.CopData.cm.name._name.field_2._M_allocated_capacity = 0;
  local_278.CopData.cm.name._name.field_2._8_8_ = 0;
  local_278.CopData.cm.name._name._M_string_length = 0;
  local_278.CopData.pn.name._name._M_dataplus._M_p =
       (pointer)&local_278.CopData.pn.name._name.field_2;
  local_278.CopData.pn.name._name.field_2._M_allocated_capacity = 0;
  local_278.CopData.pn.name._name.field_2._8_8_ = 0;
  local_278.CopData.pn.name._name._M_string_length = 0;
  local_278.CopData.CpopExpression.expression.
  super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_278.CopData.CpopExpression.expression.
  super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_278.CopData.CpopExpression.constExpression = true;
  local_278.CopData.CpinfExpression.expression.
  super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_278.CopData.CpinfExpression.expression.
  super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_278.CopData.CpinfExpression.constExpression = true;
  local_278.rs.name._name._M_dataplus._M_p = (pointer)&local_278.rs.name._name.field_2;
  local_278.rs.name._name.field_2._M_allocated_capacity = 0;
  local_278.rs.name._name.field_2._8_8_ = 0;
  local_278.rs.name._name._M_string_length = 0;
  local_278.rm.name._name._M_dataplus._M_p = (pointer)&local_278.rm.name._name.field_2;
  local_278.rm.name._name.field_2._M_allocated_capacity = 0;
  local_278.rm.name._name.field_2._8_8_ = 0;
  local_278.rm.name._name._M_string_length = 0;
  local_278.rd.name._name._M_dataplus._M_p = (pointer)&local_278.rd.name._name.field_2;
  local_278.rd.name._name.field_2._M_allocated_capacity = 0;
  local_278.rd.name._name.field_2._8_8_ = 0;
  local_278.rd.name._name._M_string_length = 0;
  local_278.rn.name._name._M_dataplus._M_p = (pointer)&local_278.rn.name._name.field_2;
  local_278.rn.name._name.field_2._M_allocated_capacity = 0;
  local_278.rn.name._name.field_2._8_8_ = 0;
  local_278.rn.name._name._M_string_length = 0;
  local_278.ImmediateExpression.expression.
  super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_278.ImmediateExpression.expression.
  super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_278.ImmediateExpression.constExpression = true;
  bVar4 = parsePsrTransfer(this,parser,&local_278,false);
  if (!bVar4) {
    dest_00 = &local_278.rd;
    (((parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer)->position).it._M_node = p_Var1;
    bVar4 = parseRegisterTable(this,parser,dest_00,armRegisters,0x13);
    if (!bVar4 || 0xf < local_278.rd.num) {
      (((parser->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
        _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer)->position).it._M_node = p_Var1;
      bVar4 = parseRegisterTable(this,parser,dest_00,armCopNumbers,0x10);
      if (!bVar4) {
        (((parser->entries).
          super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
          super__Vector_impl_data._M_finish[-1].tokenizer)->position).it._M_node = p_Var1;
        bVar4 = parseRegisterTable(this,parser,dest_00,armCopRegisters,0x10);
        if (!bVar4) {
          (((parser->entries).
            super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].tokenizer)->position).it._M_node = p_Var1;
          Parser::parseExpression(&local_298,parser);
          _Var3._M_pi = local_298.expression.
                        super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
          peVar2 = local_298.expression.
                   super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          local_298.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)0x0;
          local_298.expression.super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this_00 = (dest->expression).
                    super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
          (dest->expression).super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = peVar2;
          (dest->expression).super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = _Var3._M_pi;
          if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            dest->constExpression = local_298.constExpression;
          }
          else {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            dest->constExpression = local_298.constExpression;
            if (local_298.expression.
                super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_298.expression.
                         super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
            }
          }
          bVar4 = (dest->expression).
                  super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0;
          goto LAB_001605ba;
        }
      }
    }
  }
  bVar4 = false;
LAB_001605ba:
  ArmOpcodeVariables::~ArmOpcodeVariables(&local_278);
  return bVar4;
}

Assistant:

bool ArmParser::parseImmediate(Parser& parser, Expression& dest)
{
	TokenizerPosition pos = parser.getTokenizer()->getPosition();

	// check if it really is an immediate
	ArmOpcodeVariables tempVars;
	if (parsePsrTransfer(parser,tempVars,false))
		return false;

	parser.getTokenizer()->setPosition(pos);
	if (parseRegister(parser,tempVars.rd))
		return false;
	
	parser.getTokenizer()->setPosition(pos);
	if (parseCopNumber(parser,tempVars.rd))
		return false;
	
	parser.getTokenizer()->setPosition(pos);
	if (parseCopRegister(parser,tempVars.rd))
		return false;
	
	parser.getTokenizer()->setPosition(pos);
	dest = parser.parseExpression();
	return dest.isLoaded();
}